

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPubKeys
          (LegacyScriptPubKeyMan *this,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          *key_origins,bool add_keypool,int64_t timestamp)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  CPubKey *pubKey;
  _Rb_tree_header *p_Var9;
  pointer __k;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  WalletBatch batch;
  CPubKey temp;
  bool local_e5;
  WalletBatch local_b0;
  string local_a0;
  byte local_79 [65];
  long local_38;
  WalletDatabase *pWVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar4 = (WalletDatabase *)CONCAT44(extraout_var,iVar3);
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_b0,pWVar4,1);
  p_Var5 = (key_origins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(key_origins->_M_t)._M_impl.super__Rb_tree_header;
  local_b0.m_database = pWVar4;
  if ((_Rb_tree_header *)p_Var5 != p_Var9) {
    do {
      AddKeyOriginWithDB(this,&local_b0,(CPubKey *)&p_Var5[1]._M_right,(KeyOriginInfo *)(p_Var5 + 4)
                        );
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var9);
  }
  __k = (ordered_pubkeys->
        super__Vector_base<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>).
        _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (ordered_pubkeys->
           super__Vector_base<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_e5 = __k == ppVar1;
  if (!local_e5) {
    do {
      cVar6 = std::
              _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
              ::find(&pubkey_map->_M_t,&__k->first);
      if ((_Rb_tree_header *)cVar6._M_node == &(pubkey_map->_M_t)._M_impl.super__Rb_tree_header) {
LAB_00bf36ce:
        iVar3 = 5;
      }
      else {
        local_79[0] = 0xff;
        iVar3 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1f])
                          (this,__k,local_79);
        if ((char)iVar3 != '\0') {
          sVar8 = 0x21;
          if ((local_79[0] & 0xfe) != 2) {
            if ((byte)(local_79[0] - 4) < 4) {
              sVar8 = (&DAT_00e5ea00)[(byte)(local_79[0] - 4)];
            }
            else {
              sVar8 = 0;
            }
          }
          s.m_size = sVar8;
          s.m_data = local_79;
          HexStr_abi_cxx11_(&local_a0,s);
          ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                    ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x1104300,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00bf36ce;
        }
        pubKey = (CPubKey *)((long)&cVar6._M_node[1]._M_left + 4);
        GetScriptForRawPubKey((CScript *)&local_a0,pubKey);
        bVar2 = AddWatchOnlyWithDB(this,&local_b0,(CScript *)&local_a0,timestamp);
        if (0x1c < (uint)local_a0.field_2._12_4_) {
          free(local_a0._M_dataplus._M_p);
          local_a0._M_dataplus._M_p = (pointer)0x0;
        }
        iVar3 = 1;
        if (bVar2) {
          pmVar7 = std::
                   map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                   ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,&__k->first);
          pmVar7->nCreateTime = timestamp;
          iVar3 = 0;
          if (add_keypool) {
            AddKeypoolPubkeyWithDB(this,pubKey,__k->second,&local_b0);
            boost::signals2::
            signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
            ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.
                          NotifyCanGetAddressesChanged);
          }
        }
      }
      if ((iVar3 != 5) && (iVar3 != 0)) break;
      __k = __k + 1;
      local_e5 = __k == ppVar1;
    } while (!local_e5);
  }
  if (local_b0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_b0.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_e5;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPubKeys(const std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys, const std::map<CKeyID, CPubKey>& pubkey_map, const std::map<CKeyID, std::pair<CPubKey, KeyOriginInfo>>& key_origins, const bool add_keypool, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : key_origins) {
        AddKeyOriginWithDB(batch, entry.second.first, entry.second.second);
    }
    for (const auto& [id, internal] : ordered_pubkeys) {
        auto entry = pubkey_map.find(id);
        if (entry == pubkey_map.end()) {
            continue;
        }
        const CPubKey& pubkey = entry->second;
        CPubKey temp;
        if (GetPubKey(id, temp)) {
            // Already have pubkey, skipping
            WalletLogPrintf("Already have pubkey %s, skipping\n", HexStr(temp));
            continue;
        }
        if (!AddWatchOnlyWithDB(batch, GetScriptForRawPubKey(pubkey), timestamp)) {
            return false;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;

        // Add to keypool only works with pubkeys
        if (add_keypool) {
            AddKeypoolPubkeyWithDB(pubkey, internal, batch);
            NotifyCanGetAddressesChanged();
        }
    }
    return true;
}